

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86_avx512.cpp
# Opt level: O0

int __thiscall
ncnn::InnerProduct_x86_avx512::forward
          (InnerProduct_x86_avx512 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  Mat *in_RCX;
  Mat *in_RDX;
  InnerProduct_x86_avx512 *in_RSI;
  long *in_RDI;
  bool bVar2;
  undefined1 auVar3 [64];
  size_t out_elemsize;
  int out_elempack;
  int elempack;
  size_t elemsize;
  Option opt_flatten;
  Mat bottom_blob_flattened;
  int elempack_1;
  size_t elemsize_1;
  int h;
  int num_input;
  Mat *in_stack_00001740;
  int in_stack_0000174c;
  Mat *in_stack_00001750;
  Mat *in_stack_00001758;
  Mat *in_stack_00001760;
  Mat *in_stack_00001768;
  Option *in_stack_00002168;
  Mat *in_stack_00002170;
  Mat *in_stack_00002178;
  InnerProduct_x86_avx512 *in_stack_00002180;
  Mat *in_stack_00003510;
  int in_stack_0000351c;
  Mat *in_stack_00003520;
  Mat *in_stack_00003528;
  Mat *in_stack_00003530;
  Mat *in_stack_00003538;
  Option *in_stack_fffffffffffffe30;
  Mat *pMVar4;
  Allocator *in_stack_fffffffffffffe40;
  int in_stack_fffffffffffffe4c;
  undefined4 in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe54;
  int in_stack_fffffffffffffe58;
  int in_stack_fffffffffffffe5c;
  Mat *in_stack_fffffffffffffe60;
  undefined8 local_148;
  size_t sStack_140;
  undefined1 auStack_138 [48];
  Mat local_108;
  undefined4 local_bc;
  void *local_b8;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  int local_84;
  
  if (((in_RCX->field_0x1e & 1) == 0) ||
     (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) == 0)) {
    iVar1 = cpu_support_x86_f16c();
    if ((iVar1 == 0) || (((ulong)in_RCX->allocator & 0x10000) == 0)) {
      if (((in_RSI->weight_data_tm).elempack == 2) &&
         (*(int *)&(in_RSI->weight_data_tm).field_0x1c ==
          *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) /
          *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0))) {
        local_b8 = (in_RSI->weight_data_tm).data;
        local_bc = *(undefined4 *)&(in_RSI->weight_data_tm).refcount;
        Mat::create(in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58,
                    CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                    in_stack_fffffffffffffe4c,in_stack_fffffffffffffe40);
        bVar2 = true;
        if (in_RDX->data != (void *)0x0) {
          bVar2 = in_RDX->cstep * (long)in_RDX->c == 0;
        }
        if (bVar2) {
          local_84 = -100;
        }
        else {
          innerproduct_gemm_sse
                    (in_stack_00003538,in_stack_00003530,in_stack_00003528,in_stack_00003520,
                     in_stack_0000351c,in_stack_00003510,in_stack_fffffffffffffe30);
          local_84 = 0;
        }
      }
      else {
        pMVar4 = &local_108;
        local_108.data = in_RSI->_vptr_InnerProduct_x86_avx512;
        local_108.refcount = (int *)in_RSI->flatten;
        local_108.allocator = (Allocator *)(in_RSI->weight_data_tm).elemsize;
        local_108.dims = (in_RSI->weight_data_tm).elempack;
        local_108.w = *(int *)&(in_RSI->weight_data_tm).field_0x1c;
        local_108.h = *(int *)&(in_RSI->weight_data_tm).allocator;
        local_108.d = *(int *)((long)&(in_RSI->weight_data_tm).allocator + 4);
        local_108.c = (in_RSI->weight_data_tm).dims;
        local_108.cstep._0_4_ = (in_RSI->weight_data_tm).h;
        local_108.cstep._4_4_ = (in_RSI->weight_data_tm).d;
        if ((Layer *)local_108.refcount != (Layer *)0x0) {
          LOCK();
          *(int *)&((Layer *)local_108.refcount)->_vptr_Layer =
               *(int *)&((Layer *)local_108.refcount)->_vptr_Layer + 1;
          UNLOCK();
        }
        if ((in_RSI->weight_data_tm).elempack != 1) {
          auVar3._0_8_ = in_RCX->data;
          auVar3._8_8_ = in_RCX->refcount;
          auVar3._16_8_ = in_RCX->elemsize;
          auVar3._24_4_ = in_RCX->elempack;
          auVar3._28_4_ = *(undefined4 *)&in_RCX->field_0x1c;
          auVar3._32_8_ = in_RCX->allocator;
          auVar3._40_4_ = in_RCX->dims;
          auVar3._44_4_ = in_RCX->w;
          auVar3._48_4_ = in_RCX->h;
          auVar3._52_4_ = in_RCX->d;
          auVar3._56_4_ = in_RCX->c;
          auVar3._60_4_ = *(undefined4 *)&in_RCX->field_0x3c;
          auVar3 = vmovdqu64_avx512f(auVar3);
          auVar3 = vmovdqu64_avx512f(auVar3);
          auStack_138 = auVar3._16_48_;
          local_148 = auVar3._0_8_;
          sStack_140 = in_RCX->elemsize;
          (**(code **)(*(long *)in_RDI[1] + 0x38))((long *)in_RDI[1],in_RSI,&local_108,&local_148);
        }
        if (((ulong)in_RCX->allocator & 0x100000000000000) != 0) {
          if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) % 0x10 == 0) {
            in_stack_fffffffffffffe54 = 0x10;
          }
          else if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) % 8 == 0) {
            in_stack_fffffffffffffe50 = 8;
            in_stack_fffffffffffffe54 = in_stack_fffffffffffffe50;
          }
          else {
            in_stack_fffffffffffffe50 = 1;
            in_stack_fffffffffffffe54 = in_stack_fffffffffffffe50;
            if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) % 4 == 0) {
              in_stack_fffffffffffffe50 = 4;
              in_stack_fffffffffffffe54 = in_stack_fffffffffffffe50;
            }
          }
        }
        Mat::create(pMVar4,in_stack_fffffffffffffe5c,
                    CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                    in_stack_fffffffffffffe4c,in_stack_fffffffffffffe40);
        bVar2 = true;
        if (in_RDX->data != (void *)0x0) {
          bVar2 = in_RDX->cstep * (long)in_RDX->c == 0;
        }
        if (bVar2) {
          local_84 = -100;
        }
        else {
          innerproduct_sse(in_stack_00001768,in_stack_00001760,in_stack_00001758,in_stack_00001750,
                           in_stack_0000174c,in_stack_00001740,in_stack_fffffffffffffe30);
          local_84 = 0;
        }
        pMVar4 = &local_108;
        if ((Layer *)local_108.refcount != (Layer *)0x0) {
          LOCK();
          iVar1 = *(int *)(_func_int ***)local_108.refcount;
          *(int *)(_func_int ***)local_108.refcount = *(int *)(_func_int ***)local_108.refcount + -1
          ;
          UNLOCK();
          if (iVar1 == 1) {
            if (local_108.allocator == (Allocator *)0x0) {
              if ((_func_int **)local_108.data != (_func_int **)0x0) {
                free(local_108.data);
              }
            }
            else {
              (*(local_108.allocator)->_vptr_Allocator[3])(local_108.allocator,local_108.data);
            }
          }
        }
        pMVar4->data = (void *)0x0;
        pMVar4->elemsize = 0;
        pMVar4->elempack = 0;
        pMVar4->dims = 0;
        pMVar4->w = 0;
        pMVar4->h = 0;
        pMVar4->d = 0;
        pMVar4->c = 0;
        pMVar4->cstep = 0;
        pMVar4->refcount = (int *)0x0;
      }
    }
    else {
      local_84 = forward_fp16s(in_RSI,in_RDX,in_RCX,
                               (Option *)
                               CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
    }
  }
  else {
    local_84 = forward_int8_x86(in_stack_00002180,in_stack_00002178,in_stack_00002170,
                                in_stack_00002168);
  }
  return local_84;
}

Assistant:

int InnerProduct_x86_avx512::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
#if NCNN_INT8
    if (opt.use_int8_inference && int8_scale_term)
    {
        return forward_int8_x86(bottom_blob, top_blob, opt);
    }
#endif

#if NCNN_F16C && __AVX__
    if (cpu_support_x86_f16c() && opt.use_fp16_storage)
    {
        return forward_fp16s(bottom_blob, top_blob, opt);
    }
#endif

    const int num_input = weight_data_size / num_output;

    if (bottom_blob.dims == 2 && bottom_blob.w == num_input)
    {
        // gemm
        int h = bottom_blob.h;
        size_t elemsize = bottom_blob.elemsize;
        int elempack = bottom_blob.elempack;

        top_blob.create(num_output, h, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        innerproduct_gemm_sse(bottom_blob, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);

        return 0;
    }

    // flatten
    Mat bottom_blob_flattened = bottom_blob;
    if (bottom_blob.dims != 1)
    {
        Option opt_flatten = opt;
        opt_flatten.blob_allocator = opt.workspace_allocator;

        flatten->forward(bottom_blob, bottom_blob_flattened, opt_flatten);
    }

    size_t elemsize = bottom_blob_flattened.elemsize;
    int elempack = bottom_blob_flattened.elempack;

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    top_blob.create(num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    innerproduct_sse(bottom_blob_flattened, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);

    return 0;
}